

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *p;
  int iVar1;
  xml_node_struct *in_RAX;
  xml_attribute_struct *pxVar2;
  char_t *__s2;
  xml_node local_38;
  
  local_38._root = in_RAX;
  if (this->_root != (xml_node_struct *)0x0) {
    for (p = this->_root->first_child; p != (xml_node_struct *)0x0; p = p->next_sibling) {
      if ((p->name != (char *)0x0) && (iVar1 = strcmp(name_,p->name), iVar1 == 0)) {
        for (pxVar2 = p->first_attribute; pxVar2 != (xml_attribute_struct *)0x0;
            pxVar2 = pxVar2->next_attribute) {
          if ((pxVar2->name != (char *)0x0) && (iVar1 = strcmp(attr_name,pxVar2->name), iVar1 == 0))
          {
            __s2 = pxVar2->value;
            if (__s2 == (char_t *)0x0) {
              __s2 = "";
            }
            iVar1 = strcmp(attr_value,__s2);
            if (iVar1 == 0) {
              xml_node(&local_38,p);
              return (xml_node)local_38._root;
            }
          }
        }
      }
    }
  }
  xml_node(&local_38);
  return (xml_node)local_38._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
				{
					const char_t* aname = a->name;
					if (aname && impl::strequal(attr_name, aname))
					{
						const char_t* avalue = a->value;
						if (impl::strequal(attr_value, avalue ? avalue : PUGIXML_TEXT("")))
							return xml_node(i);
					}
				}
			}
		}

		return xml_node();
	}